

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O1

LY_ERR ly_in_new_filepath(char *filepath,size_t len,ly_in **in)

{
  ly_in *plVar1;
  int fd;
  LY_ERR LVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  
  if (filepath == (char *)0x0) {
    pcVar3 = "filepath";
  }
  else {
    if (in != (ly_in **)0x0) {
      if (len == 0) {
        pcVar3 = strdup(filepath);
      }
      else {
        pcVar3 = strndup(filepath,len);
      }
      fd = open(pcVar3,0);
      if (fd == -1) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        LVar2 = LY_ESYS;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Failed to open file \"%s\" (%s).",pcVar3,pcVar5);
      }
      else {
        LVar2 = ly_in_new_fd(fd,in);
        if (LVar2 == LY_SUCCESS) {
          plVar1 = *in;
          plVar1->type = LY_IN_FILEPATH;
          (plVar1->method).fd = fd;
          ((*in)->method).fpath.filepath = pcVar3;
          return LY_SUCCESS;
        }
      }
      free(pcVar3);
      return LVar2;
    }
    pcVar3 = "in";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"ly_in_new_filepath")
  ;
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_new_filepath(const char *filepath, size_t len, struct ly_in **in)
{
    LY_ERR ret;
    char *fp;
    int fd;

    LY_CHECK_ARG_RET(NULL, filepath, in, LY_EINVAL);

    if (len) {
        fp = strndup(filepath, len);
    } else {
        fp = strdup(filepath);
    }

    fd = open(fp, O_RDONLY);
    LY_CHECK_ERR_RET(fd == -1, LOGERR(NULL, LY_ESYS, "Failed to open file \"%s\" (%s).", fp, strerror(errno)); free(fp),
            LY_ESYS);

    LY_CHECK_ERR_RET(ret = ly_in_new_fd(fd, in), free(fp), ret);

    /* convert the LY_IN_FD input handler into the LY_IN_FILE */
    (*in)->type = LY_IN_FILEPATH;
    (*in)->method.fpath.fd = fd;
    (*in)->method.fpath.filepath = fp;

    return LY_SUCCESS;
}